

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O1

void HeapProfileTable::CleanupOldProfiles(char *prefix)

{
  char *__s;
  int iVar1;
  long *plVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  undefined1 *puVar7;
  undefined1 local_c0 [8];
  glob_t g;
  long local_68 [2];
  size_type *local_58;
  string pattern;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_cleanup_old_heap_profiles
      == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&g.gl_stat,prefix,(allocator<char> *)(pattern.field_2._M_local_buf + 0xf));
    plVar2 = (long *)std::__cxx11::string::append((char *)&g.gl_stat);
    plVar5 = plVar2 + 2;
    if ((char ***)*plVar2 == (char ***)plVar5) {
      g.gl_pathv = (char **)*plVar5;
      g.gl_offs = plVar2[3];
      local_c0 = (undefined1  [8])&g.gl_pathv;
    }
    else {
      g.gl_pathv = (char **)*plVar5;
      local_c0 = (undefined1  [8])*plVar2;
    }
    g.gl_pathc = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append(local_c0);
    local_58 = &pattern._M_string_length;
    psVar6 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar6) {
      pattern._M_string_length = *psVar6;
      pattern.field_2._M_allocated_capacity = plVar2[3];
    }
    else {
      pattern._M_string_length = *psVar6;
      local_58 = (size_type *)*plVar2;
    }
    pattern._M_dataplus._M_p = (pointer)plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_c0 != (undefined1  [8])&g.gl_pathv) {
      operator_delete((void *)local_c0,(long)g.gl_pathv + 1);
    }
    if (g.gl_stat != (_func_int_char_ptr_stat_ptr *)local_68) {
      operator_delete(g.gl_stat,local_68[0] + 1);
    }
    iVar1 = glob((char *)local_58,1,(__errfunc *)0x0,(glob_t *)local_c0);
    if (((iVar1 == 3) || (iVar1 == 0)) && (local_c0 != (undefined1  [8])0x0)) {
      sVar3 = strlen(prefix);
      puVar7 = (undefined1 *)0x0;
      do {
        __s = *(char **)(g.gl_pathc + (long)puVar7 * 8);
        sVar4 = strlen(__s);
        if ((ulong)(long)(int)sVar3 <= sVar4) {
          iVar1 = bcmp(__s,prefix,(long)(int)sVar3);
          if (iVar1 == 0) {
            RAW_VLOG(1,"Removing old heap profile %s",__s);
            unlink(__s);
          }
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < (ulong)local_c0);
    }
    globfree((glob_t *)local_c0);
    if (local_58 != &pattern._M_string_length) {
      operator_delete(local_58,pattern._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void HeapProfileTable::CleanupOldProfiles(const char* prefix) {
  if (!FLAGS_cleanup_old_heap_profiles)
    return;
  std::string pattern = std::string(prefix) + ".*" + kFileExt;
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), GLOB_ERR, nullptr, &g);
  if (r == 0 || r == GLOB_NOMATCH) {
    const int prefix_length = strlen(prefix);
    for (int i = 0; i < g.gl_pathc; i++) {
      const char* fname = g.gl_pathv[i];
      if ((strlen(fname) >= prefix_length) &&
          (memcmp(fname, prefix, prefix_length) == 0)) {
        RAW_VLOG(1, "Removing old heap profile %s", fname);
        unlink(fname);
      }
    }
  }
  globfree(&g);
#else   /* HAVE_GLOB_H */
  RAW_LOG(WARNING, "Unable to remove old heap profiles (can't run glob())");
#endif
}